

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
::matches(Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
          *this,candidate_t<wasm::Const_*> candidate)

{
  bool bVar1;
  
  if (candidate->_id == ConstId) {
    if (this->binder != (matched_t<wasm::Const_*> *)0x0) {
      *this->binder = (matched_t<wasm::Const_*>)candidate;
    }
    bVar1 = Components<wasm::Const_*,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
            ::match((matched_t<wasm::Const_*>)candidate,&this->submatchers);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }